

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegionSection *
address_space_translate_for_iotlb_m68k
          (CPUState *cpu,int asidx,hwaddr addr,hwaddr *xlat,hwaddr *plen,MemTxAttrs attrs,int *prot)

{
  AddressSpaceDispatch *d;
  MemoryRegion *pMVar1;
  hwaddr hVar2;
  MemoryRegionSection *pMVar3;
  AddressSpaceDispatch **ppAVar4;
  uint uVar5;
  hwaddr local_68;
  hwaddr *local_60;
  long local_58 [2];
  ulong local_48;
  ulong local_40;
  uint local_38;
  
  ppAVar4 = &cpu->cpu_ases[asidx].memory_dispatch;
  local_68 = addr;
  local_60 = xlat;
  while( true ) {
    d = *ppAVar4;
    pMVar3 = address_space_translate_internal(d,local_68,&local_68,plen,false);
    pMVar1 = pMVar3->mr;
    if ((pMVar1 == (MemoryRegion *)0x0) || (pMVar1->is_iommu == false)) {
      *local_60 = local_68;
      if ((pMVar1->ram == false) && (pMVar3 == (d->map).sections)) {
        *prot = 0;
      }
      return pMVar3;
    }
    (**(code **)&pMVar1[1].field_0x28)(pMVar1,attrs);
    hVar2 = local_68;
    (*(code *)pMVar1[1].ops)(local_58,pMVar1,local_68,0);
    local_68 = (hVar2 ^ local_48) & local_40 ^ local_48;
    if ((local_38 & 1) == 0) {
      *(byte *)prot = (byte)*prot & 0xfa;
    }
    uVar5 = *prot;
    if ((local_38 & 2) == 0) {
      uVar5 = uVar5 & 0xfffffffd;
      *prot = uVar5;
    }
    if (uVar5 == 0) break;
    ppAVar4 = (AddressSpaceDispatch **)(*(long *)(local_58[0] + 8) + 0x18);
  }
  return (d->map).sections;
}

Assistant:

MemoryRegionSection *
address_space_translate_for_iotlb(CPUState *cpu, int asidx, hwaddr addr,
                                  hwaddr *xlat, hwaddr *plen,
                                  MemTxAttrs attrs, int *prot)
{
    MemoryRegionSection *section;
    IOMMUMemoryRegion *iommu_mr;
    IOMMUMemoryRegionClass *imrc;
    IOMMUTLBEntry iotlb;
    int iommu_idx;
    AddressSpaceDispatch *d = cpu->cpu_ases[asidx].memory_dispatch;

    for (;;) {
        section = address_space_translate_internal(d, addr, &addr, plen, false);

        iommu_mr = memory_region_get_iommu(section->mr);
        if (!iommu_mr) {
            break;
        }

        imrc = memory_region_get_iommu_class_nocheck(iommu_mr);

        iommu_idx = imrc->attrs_to_index(iommu_mr, attrs);

        // tcg_register_iommu_notifier(cpu, iommu_mr, iommu_idx);

        /* We need all the permissions, so pass IOMMU_NONE so the IOMMU
         * doesn't short-cut its translation table walk.
         */
        iotlb = imrc->translate(iommu_mr, addr, IOMMU_NONE, iommu_idx);
        addr = ((iotlb.translated_addr & ~iotlb.addr_mask)
                | (addr & iotlb.addr_mask));
        /* Update the caller's prot bits to remove permissions the IOMMU
         * is giving us a failure response for. If we get down to no
         * permissions left at all we can give up now.
         */
        if (!(iotlb.perm & IOMMU_RO)) {
            *prot &= ~(PAGE_READ | PAGE_EXEC);
        }
        if (!(iotlb.perm & IOMMU_WO)) {
            *prot &= ~PAGE_WRITE;
        }

        if (!*prot) {
            goto translate_fail;
        }

        d = flatview_to_dispatch(address_space_to_flatview(iotlb.target_as));
    }

    assert(!(memory_region_get_iommu(section->mr) != NULL));
    *xlat = addr;
    // Unicorn:
    //   If there is no memory mapped but still we start emulation, we will get
    //   a default memory region section and it would be marked as an IO memory
    //   in cputlb which prevents further fecthing and execution.
    //
    //   The reason we set prot to 0 here is not to setting protection but to notify
    //   the outer function to add a new **blank** tlb which will never be hitted.
    if (!memory_region_is_ram(section->mr) && section == &d->map.sections[PHYS_SECTION_UNASSIGNED]) {
        *prot = 0;
    }
    return section;

translate_fail:
    return &d->map.sections[PHYS_SECTION_UNASSIGNED];
}